

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::LineInterpolationTest::iterate(LineInterpolationTest *this)

{
  undefined8 *puVar1;
  size_type *psVar2;
  undefined8 uVar3;
  PixelFormat PVar4;
  TestLog *log;
  LineInterpolationTest *pLVar5;
  LineInterpolationMethod LVar6;
  int iVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int vtxNdx;
  long lVar14;
  bool bVar15;
  float extraout_XMM0_Da;
  float fVar16;
  float extraout_XMM0_Da_00;
  allocator<char> local_2b1;
  LineInterpolationTest *local_2b0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  _Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
  local_238;
  ScopedLogSection section;
  Surface resultImage;
  RasterizationArguments local_1f8;
  string iterationDescription;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  float local_198 [6];
  float afStack_180 [84];
  
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(colorBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,this->m_iteration + 1);
  local_2b0 = this;
  de::toString<int>((string *)&resultImage,(int *)&colorBuffer);
  std::operator+(&local_258,"Test iteration ",(string *)&resultImage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_258," / ");
  de::toString<int>((string *)&drawBuffer,&local_2b0->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&drawBuffer);
  std::__cxx11::string::~string((string *)&drawBuffer);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&resultImage);
  log = ((local_2b0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
        )->m_log;
  resultImage.m_width = local_2b0->m_iteration + 1;
  de::toString<int>(&local_258,&resultImage.m_width);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 "Iteration",&local_258);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b8,&iterationDescription);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_258);
  pLVar5 = local_2b0;
  (*(local_2b0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [5])(local_2b0);
  iVar7 = (pLVar5->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar7,iVar7);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pLVar5->m_maxLineWidth < extraout_XMM0_Da) {
    local_1b8 = (undefined1  [8])
                ((pLVar5->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::operator<<((ostream *)&pp_Stack_1b0,"Line width ");
    std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,extraout_XMM0_Da);
    std::operator<<((ostream *)&pp_Stack_1b0," not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    goto LAB_00f7c3b7;
  }
  local_1b8 = (undefined1  [8])0x3f800000;
  pp_Stack_1b0 = (_func_int **)0x3f80000000000000;
  local_1a8._M_allocated_capacity = 0x3f80000000000000;
  local_1a8._8_8_ = 0x3f80000000000000;
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  local_198[2] = 1.0;
  local_198[3] = 1.0;
  deRandom_init((deRandom *)&local_258,
                pLVar5->m_iteration * 1000 + *(int *)&(pLVar5->super_BaseRenderingCase).field_0xc4 +
                0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&colorBuffer,6);
  iVar7 = 1;
  lVar12 = 0;
  for (uVar13 = 0;
      (long)uVar13 <
      (long)(int)((ulong)((long)drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4); uVar13 = uVar13 + 1
      ) {
    fVar16 = deRandom_getFloat((deRandom *)&local_258);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12) =
         fVar16 * 1.8 + -0.9;
    fVar16 = deRandom_getFloat((deRandom *)&local_258);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + 4) =
         fVar16 * 1.8 + -0.9;
    *(undefined4 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + 8) = 0;
    fVar16 = 1.0;
    if (local_2b0->m_projective == true) {
      fVar16 = deRandom_getFloat((deRandom *)&local_258);
      fVar16 = fVar16 * 3.8 + 0.2;
      uVar3 = *(undefined8 *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      *(ulong *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12) =
           CONCAT44(fVar16 * (float)((ulong)uVar3 >> 0x20),fVar16 * (float)uVar3);
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + 8) =
           *(float *)((long)(drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + 8) *
           fVar16;
    }
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + 0xc) = fVar16;
    uVar3 = *(undefined8 *)((long)(local_1b8 + lVar12 + (uVar13 / 3) * -0x30) + 8);
    puVar1 = (undefined8 *)
             ((long)(colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
    *puVar1 = *(undefined8 *)(local_1b8 + lVar12 + (uVar13 / 3) * -0x30);
    puVar1[1] = uVar3;
    lVar12 = lVar12 + 0x10;
  }
  iVar11 = *(int *)&(local_2b0->super_BaseRenderingCase).field_0xc4;
  if (iVar11 == 1) {
    for (iVar7 = 1; iVar11 = iVar7 + -1,
        iVar11 < (int)((ulong)((long)drawBuffer.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
        iVar7 = iVar7 + 2) {
      tcu::LineSceneSpec::SceneLine::SceneLine((SceneLine *)local_1b8);
      local_1b8 = *(undefined1 (*) [8])
                   drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data;
      pp_Stack_1b0 = *(_func_int ***)
                      (drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data + 2);
      local_1a8._M_allocated_capacity =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar7].m_data;
      local_1a8._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar7].m_data + 2);
      if ((local_2b0->super_BaseRenderingCase).m_flatshade == true) {
        local_198._0_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar7].m_data;
        local_198._8_8_ =
             *(undefined8 *)
              (colorBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar7].m_data + 2);
      }
      else {
        local_198._0_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar11].m_data;
        local_198._8_8_ =
             *(undefined8 *)
              (colorBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar11].m_data + 2);
      }
      local_198._16_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar7].m_data;
      afStack_180._0_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar7].m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_238,(SceneLine *)local_1b8);
    }
  }
  else if (iVar11 == 3) {
    lVar12 = 0x10;
    lVar14 = 0;
    while (lVar14 < ((long)drawBuffer.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                    0x20) {
      tcu::LineSceneSpec::SceneLine::SceneLine((SceneLine *)local_1b8);
      puVar1 = (undefined8 *)
               ((long)drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar12);
      local_1b8 = (undefined1  [8])*puVar1;
      pp_Stack_1b0 = (_func_int **)puVar1[1];
      lVar14 = lVar14 + 1;
      psVar2 = (size_type *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      local_1a8._M_allocated_capacity = *psVar2;
      local_1a8._8_8_ = psVar2[1];
      if ((local_2b0->super_BaseRenderingCase).m_flatshade == true) {
        pfVar8 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        local_198._0_8_ = *(undefined8 *)pfVar8;
        local_198._8_8_ = *(undefined8 *)(pfVar8 + 2);
        lVar9 = lVar12;
      }
      else {
        pfVar8 = (float *)((long)colorBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar12);
        local_198._0_8_ = *(undefined8 *)pfVar8;
        local_198._8_8_ = *(undefined8 *)(pfVar8 + 2);
        lVar9 = lVar14 * 0x10;
      }
      pfVar8 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9);
      local_198._16_8_ = *(undefined8 *)pfVar8;
      afStack_180._0_8_ = *(undefined8 *)(pfVar8 + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_238,(SceneLine *)local_1b8);
      lVar12 = lVar12 + 0x10;
    }
  }
  else if (iVar11 == 2) {
    for (; iVar7 + -1 <
           (int)((ulong)((long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4); iVar7 = iVar7 + 1) {
      tcu::LineSceneSpec::SceneLine::SceneLine((SceneLine *)local_1b8);
      iVar11 = (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uVar13 = (long)(iVar7 + -1) % (long)iVar11 & 0xffffffff;
      local_1b8 = *(undefined1 (*) [8])
                   drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].m_data;
      pp_Stack_1b0 = *(_func_int ***)
                      (drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].m_data + 2);
      uVar10 = (long)iVar7 % (long)iVar11 & 0xffffffff;
      local_1a8._M_allocated_capacity =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10].m_data;
      local_1a8._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar10].m_data + 2);
      if ((local_2b0->super_BaseRenderingCase).m_flatshade == true) {
        local_198._0_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10].m_data;
        local_198._8_8_ =
             *(undefined8 *)
              (colorBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10].m_data + 2);
      }
      else {
        local_198._0_8_ =
             *(undefined8 *)
              colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar13].m_data;
        local_198._8_8_ =
             *(undefined8 *)
              (colorBuffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13].m_data + 2);
      }
      local_198._16_8_ =
           *(undefined8 *)
            colorBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10].m_data;
      afStack_180._0_8_ =
           *(undefined8 *)
            (colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar10].m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_238,(SceneLine *)local_1b8);
    }
  }
  local_1b8 = (undefined1  [8])
              ((local_2b0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::operator<<((ostream *)&pp_Stack_1b0,"Generated vertices:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  lVar12 = 0;
  for (lVar14 = 0;
      lVar14 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar14 = lVar14 + 1) {
    local_1b8 = (undefined1  [8])
                ((local_2b0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::operator<<((ostream *)&pp_Stack_1b0,"\t");
    tcu::operator<<((ostream *)&pp_Stack_1b0,
                    (Vector<float,_4> *)
                    ((long)(drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12));
    std::operator<<((ostream *)&pp_Stack_1b0,",\tcolor= ");
    tcu::operator<<((ostream *)&pp_Stack_1b0,
                    (Vector<float,_4> *)
                    ((long)(colorBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    lVar12 = lVar12 + 0x10;
  }
  BaseRenderingCase::drawPrimitives
            (&local_2b0->super_BaseRenderingCase,&resultImage,&drawBuffer,&colorBuffer,
             *(GLenum *)&(local_2b0->super_BaseRenderingCase).field_0xc4);
  pLVar5 = local_2b0;
  local_1f8.numSamples = (local_2b0->super_BaseRenderingCase).m_numSamples;
  local_1f8.subpixelBits = (local_2b0->super_BaseRenderingCase).m_subpixelBits;
  PVar4 = (local_2b0->super_BaseRenderingCase).m_pixelFormat;
  local_1f8.redBits = PVar4.redBits;
  local_1f8.greenBits = PVar4.greenBits;
  local_1f8.blueBits = (local_2b0->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_258._M_dataplus._M_p = (pointer)local_238._M_impl.super__Vector_impl_data._M_start;
  local_258._M_string_length = (size_type)local_238._M_impl.super__Vector_impl_data._M_finish;
  local_258.field_2._M_allocated_capacity =
       (size_type)local_238._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(local_2b0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [5])(local_2b0);
  local_258.field_2._8_4_ = extraout_XMM0_Da_00;
  LVar6 = tcu::verifyLineGroupInterpolation
                    (&resultImage,(LineSceneSpec *)&local_258,&local_1f8,
                     ((pLVar5->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                     .m_testCtx)->m_log);
  if (LVar6 == LINEINTERPOLATION_STRICTLY_CORRECT) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1b8,"Pass",&local_2b1);
    tcu::ResultCollector::addResult(&local_2b0->m_result,QP_TEST_RESULT_PASS,(string *)local_1b8);
LAB_00f7c3a0:
    std::__cxx11::string::~string((string *)local_1b8);
  }
  else {
    if (LVar6 == LINEINTERPOLATION_PROJECTED) {
      local_1b8 = (undefined1  [8])
                  ((local_2b0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::operator<<((ostream *)&pp_Stack_1b0,
                      "Interpolation was calculated using coordinates projected onto major axis. This method does not produce the same values as the non-projecting method defined in the specification."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,"Interpolation was calculated using projected coordinateds",
                 &local_2b1);
      tcu::ResultCollector::addResult
                (&local_2b0->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1b8);
      goto LAB_00f7c3a0;
    }
    if (LVar6 == LINEINTERPOLATION_INCORRECT) {
      if ((((float)local_258.field_2._8_4_ == 1.0) && (!NAN((float)local_258.field_2._8_4_))) ||
         ((local_2b0->super_BaseRenderingCase).m_numSamples < 2)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b8,"Found invalid pixel values",&local_2b1);
        tcu::ResultCollector::addResult
                  (&local_2b0->m_result,QP_TEST_RESULT_FAIL,(string *)local_1b8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b8,"Interpolation of multisampled wide lines failed",&local_2b1)
        ;
        tcu::ResultCollector::addResult
                  (&local_2b0->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)local_1b8);
      }
      goto LAB_00f7c3a0;
    }
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_258);
LAB_00f7c3b7:
  iVar7 = local_2b0->m_iteration + 1;
  local_2b0->m_iteration = iVar7;
  bVar15 = iVar7 != local_2b0->m_iterationCount;
  if (!bVar15) {
    tcu::ResultCollector::setTestContextResult
              (&local_2b0->m_result,
               (local_2b0->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base(&local_238);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return (uint)bVar15;
}

Assistant:

LineInterpolationTest::IterateResult LineInterpolationTest::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// generate scene
		generateVertices(m_iteration, drawBuffer, colorBuffer);
		extractLines(lines, drawBuffer, colorBuffer);

		// log
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
			for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
				m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
		}

		// draw image
		drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;
			LineInterpolationMethod	iterationResult;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.lines.swap(lines);
			scene.lineWidth = getLineWidth();

			iterationResult = verifyLineGroupInterpolation(resultImage, scene, args, m_testCtx.getLog());
			switch (iterationResult)
			{
				case tcu::LINEINTERPOLATION_STRICTLY_CORRECT:
					// line interpolation matches the specification
					m_result.addResult(QP_TEST_RESULT_PASS, "Pass");
					break;

				case tcu::LINEINTERPOLATION_PROJECTED:
					// line interpolation weights are otherwise correct, but they are projected onto major axis
					m_testCtx.getLog()	<< tcu::TestLog::Message
										<< "Interpolation was calculated using coordinates projected onto major axis. "
										"This method does not produce the same values as the non-projecting method defined in the specification."
										<< tcu::TestLog::EndMessage;
					m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Interpolation was calculated using projected coordinateds");
					break;

				case tcu::LINEINTERPOLATION_INCORRECT:
					if (scene.lineWidth != 1.0f && m_numSamples > 1)
					{
						// multisampled wide lines might not be supported
						m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Interpolation of multisampled wide lines failed");
					}
					else
					{
						// line interpolation is incorrect
						m_result.addResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	else
		return CONTINUE;
}